

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositeEvaluationTest.cpp
# Opt level: O0

int main(int param_1,char **param_2)

{
  byte bVar1;
  double dVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  char *__rhs_00;
  Variable y;
  Variable x;
  string *in_stack_fffffffffffffcf8;
  Variable *in_stack_fffffffffffffd00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd08;
  undefined7 in_stack_fffffffffffffd38;
  string local_2b0 [32];
  string local_290 [32];
  string local_270 [16];
  Variable *in_stack_fffffffffffffda0;
  Expression *in_stack_fffffffffffffda8;
  string local_250 [32];
  string local_230 [32];
  Expression *in_stack_fffffffffffffdf0;
  Variable *in_stack_fffffffffffffdf8;
  string local_1f0 [32];
  string local_1d0 [80];
  string local_180 [32];
  string local_160 [32];
  string local_140 [32];
  string local_120 [32];
  string local_100 [32];
  string local_e0 [32];
  string local_c0 [32];
  string local_a0 [156];
  int local_4;
  
  local_4 = 0;
  Kandinsky::Variable::Variable((Variable *)0x1164ae);
  Kandinsky::Variable::Variable((Variable *)0x1164bb);
  Kandinsky::Variable::setValue(in_stack_fffffffffffffd00,(double)in_stack_fffffffffffffcf8);
  Kandinsky::Variable::setValue(in_stack_fffffffffffffd00,(double)in_stack_fffffffffffffcf8);
  Kandinsky::operator+<Kandinsky::Variable,_Kandinsky::Variable,_nullptr>
            ((Variable *)in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
  Kandinsky::operator*<Kandinsky::Variable,_Kandinsky::Expression,_nullptr>
            (in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
  dVar2 = Kandinsky::Expression::evaluate((Expression *)0x116536);
  bVar1 = -(dVar2 == 15.0) & 1;
  Kandinsky::Variable::evaluate((Variable *)0x11656a);
  std::__cxx11::to_string((double)in_stack_fffffffffffffd08);
  std::operator+(in_stack_fffffffffffffd08,(char *)in_stack_fffffffffffffd00);
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          Kandinsky::Variable::evaluate((Variable *)0x1165b2);
  std::__cxx11::to_string((double)in_stack_fffffffffffffd08);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(bVar1,in_stack_fffffffffffffd38),__rhs);
  std::operator+(in_stack_fffffffffffffd08,(char *)in_stack_fffffffffffffd00);
  Kandinsky::Variable::evaluate((Variable *)0x116619);
  std::__cxx11::to_string((double)in_stack_fffffffffffffd08);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(bVar1,in_stack_fffffffffffffd38),__rhs);
  std::operator+(in_stack_fffffffffffffd08,(char *)in_stack_fffffffffffffd00);
  Kandinsky::assertOrExit
            (SUB81((ulong)in_stack_fffffffffffffd00 >> 0x38,0),in_stack_fffffffffffffcf8);
  std::__cxx11::string::~string(local_a0);
  std::__cxx11::string::~string(local_c0);
  std::__cxx11::string::~string(local_180);
  std::__cxx11::string::~string(local_e0);
  std::__cxx11::string::~string(local_100);
  std::__cxx11::string::~string(local_160);
  std::__cxx11::string::~string(local_120);
  std::__cxx11::string::~string(local_140);
  Kandinsky::Expression::~Expression((Expression *)0x116701);
  Kandinsky::Expression::~Expression((Expression *)0x11670e);
  Kandinsky::operator*<Kandinsky::Variable,_Kandinsky::Variable,_nullptr>
            (in_stack_fffffffffffffdf8,(Variable *)in_stack_fffffffffffffdf0);
  Kandinsky::operator+<Kandinsky::Expression,_Kandinsky::Variable,_nullptr>
            (in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
  Kandinsky::Expression::evaluate((Expression *)0x116754);
  Kandinsky::Variable::evaluate((Variable *)0x116788);
  std::__cxx11::to_string((double)in_stack_fffffffffffffd08);
  std::operator+(in_stack_fffffffffffffd08,(char *)in_stack_fffffffffffffd00);
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          Kandinsky::Variable::evaluate((Variable *)0x1167d0);
  std::__cxx11::to_string((double)__lhs);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(bVar1,in_stack_fffffffffffffd38),__rhs);
  std::operator+(__lhs,(char *)in_stack_fffffffffffffd00);
  __rhs_00 = (char *)Kandinsky::Variable::evaluate((Variable *)0x116831);
  std::__cxx11::to_string((double)__lhs);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(bVar1,in_stack_fffffffffffffd38),__rhs);
  std::operator+(__lhs,__rhs_00);
  Kandinsky::assertOrExit(SUB81((ulong)__rhs_00 >> 0x38,0),in_stack_fffffffffffffcf8);
  std::__cxx11::string::~string(local_1d0);
  std::__cxx11::string::~string(local_1f0);
  std::__cxx11::string::~string(local_2b0);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffdf0);
  std::__cxx11::string::~string(local_230);
  std::__cxx11::string::~string(local_290);
  std::__cxx11::string::~string(local_250);
  std::__cxx11::string::~string(local_270);
  Kandinsky::Expression::~Expression((Expression *)0x11690d);
  Kandinsky::Expression::~Expression((Expression *)0x11691a);
  local_4 = 0;
  Kandinsky::Variable::~Variable((Variable *)0x116932);
  Kandinsky::Variable::~Variable((Variable *)0x11693f);
  return local_4;
}

Assistant:

int main (int /*argc*/, char** /*argv*/)
{
    Variable x;
    Variable y;
    x.setValue(3);
    y.setValue(2);
    assertOrExit((x * (x + y)).evaluate() == 15, std::to_string(x.evaluate()) + " * (" + std::to_string(x.evaluate()) + " + " + std::to_string(y.evaluate()) + ") != 15");
    assertOrExit((x * x + y).evaluate() == 11, std::to_string(x.evaluate()) + " * " + std::to_string(x.evaluate()) + " + " + std::to_string(y.evaluate()) + " != 11");

    return 0;
}